

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetB.c
# Opt level: O3

void fiat_id_tc26_gost_3410_2012_512_paramSetB_from_bytes(uint64_t *out1,uint8_t *arg1)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  
  uVar1 = *(uint64_t *)(arg1 + 8);
  uVar2 = *(uint64_t *)(arg1 + 0x10);
  uVar3 = *(uint64_t *)(arg1 + 0x18);
  uVar4 = *(uint64_t *)(arg1 + 0x20);
  uVar5 = *(uint64_t *)(arg1 + 0x28);
  uVar6 = *(uint64_t *)(arg1 + 0x30);
  uVar7 = *(uint64_t *)(arg1 + 0x38);
  *out1 = *(uint64_t *)arg1;
  out1[1] = uVar1;
  out1[2] = uVar2;
  out1[3] = uVar3;
  out1[4] = uVar4;
  out1[5] = uVar5;
  out1[6] = uVar6;
  out1[7] = uVar7;
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_512_paramSetB_from_bytes(
    uint64_t out1[8], const uint8_t arg1[64]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    uint64_t x6;
    uint64_t x7;
    uint8_t x8;
    uint64_t x9;
    uint64_t x10;
    uint64_t x11;
    uint64_t x12;
    uint64_t x13;
    uint64_t x14;
    uint64_t x15;
    uint8_t x16;
    uint64_t x17;
    uint64_t x18;
    uint64_t x19;
    uint64_t x20;
    uint64_t x21;
    uint64_t x22;
    uint64_t x23;
    uint8_t x24;
    uint64_t x25;
    uint64_t x26;
    uint64_t x27;
    uint64_t x28;
    uint64_t x29;
    uint64_t x30;
    uint64_t x31;
    uint8_t x32;
    uint64_t x33;
    uint64_t x34;
    uint64_t x35;
    uint64_t x36;
    uint64_t x37;
    uint64_t x38;
    uint64_t x39;
    uint8_t x40;
    uint64_t x41;
    uint64_t x42;
    uint64_t x43;
    uint64_t x44;
    uint64_t x45;
    uint64_t x46;
    uint64_t x47;
    uint8_t x48;
    uint64_t x49;
    uint64_t x50;
    uint64_t x51;
    uint64_t x52;
    uint64_t x53;
    uint64_t x54;
    uint64_t x55;
    uint8_t x56;
    uint64_t x57;
    uint64_t x58;
    uint64_t x59;
    uint64_t x60;
    uint64_t x61;
    uint64_t x62;
    uint64_t x63;
    uint8_t x64;
    uint64_t x65;
    uint64_t x66;
    uint64_t x67;
    uint64_t x68;
    uint64_t x69;
    uint64_t x70;
    uint64_t x71;
    uint64_t x72;
    uint64_t x73;
    uint64_t x74;
    uint64_t x75;
    uint64_t x76;
    uint64_t x77;
    uint64_t x78;
    uint64_t x79;
    uint64_t x80;
    uint64_t x81;
    uint64_t x82;
    uint64_t x83;
    uint64_t x84;
    uint64_t x85;
    uint64_t x86;
    uint64_t x87;
    uint64_t x88;
    uint64_t x89;
    uint64_t x90;
    uint64_t x91;
    uint64_t x92;
    uint64_t x93;
    uint64_t x94;
    uint64_t x95;
    uint64_t x96;
    uint64_t x97;
    uint64_t x98;
    uint64_t x99;
    uint64_t x100;
    uint64_t x101;
    uint64_t x102;
    uint64_t x103;
    uint64_t x104;
    uint64_t x105;
    uint64_t x106;
    uint64_t x107;
    uint64_t x108;
    uint64_t x109;
    uint64_t x110;
    uint64_t x111;
    uint64_t x112;
    uint64_t x113;
    uint64_t x114;
    uint64_t x115;
    uint64_t x116;
    uint64_t x117;
    uint64_t x118;
    uint64_t x119;
    uint64_t x120;
    x1 = ((uint64_t)(arg1[63]) << 56);
    x2 = ((uint64_t)(arg1[62]) << 48);
    x3 = ((uint64_t)(arg1[61]) << 40);
    x4 = ((uint64_t)(arg1[60]) << 32);
    x5 = ((uint64_t)(arg1[59]) << 24);
    x6 = ((uint64_t)(arg1[58]) << 16);
    x7 = ((uint64_t)(arg1[57]) << 8);
    x8 = (arg1[56]);
    x9 = ((uint64_t)(arg1[55]) << 56);
    x10 = ((uint64_t)(arg1[54]) << 48);
    x11 = ((uint64_t)(arg1[53]) << 40);
    x12 = ((uint64_t)(arg1[52]) << 32);
    x13 = ((uint64_t)(arg1[51]) << 24);
    x14 = ((uint64_t)(arg1[50]) << 16);
    x15 = ((uint64_t)(arg1[49]) << 8);
    x16 = (arg1[48]);
    x17 = ((uint64_t)(arg1[47]) << 56);
    x18 = ((uint64_t)(arg1[46]) << 48);
    x19 = ((uint64_t)(arg1[45]) << 40);
    x20 = ((uint64_t)(arg1[44]) << 32);
    x21 = ((uint64_t)(arg1[43]) << 24);
    x22 = ((uint64_t)(arg1[42]) << 16);
    x23 = ((uint64_t)(arg1[41]) << 8);
    x24 = (arg1[40]);
    x25 = ((uint64_t)(arg1[39]) << 56);
    x26 = ((uint64_t)(arg1[38]) << 48);
    x27 = ((uint64_t)(arg1[37]) << 40);
    x28 = ((uint64_t)(arg1[36]) << 32);
    x29 = ((uint64_t)(arg1[35]) << 24);
    x30 = ((uint64_t)(arg1[34]) << 16);
    x31 = ((uint64_t)(arg1[33]) << 8);
    x32 = (arg1[32]);
    x33 = ((uint64_t)(arg1[31]) << 56);
    x34 = ((uint64_t)(arg1[30]) << 48);
    x35 = ((uint64_t)(arg1[29]) << 40);
    x36 = ((uint64_t)(arg1[28]) << 32);
    x37 = ((uint64_t)(arg1[27]) << 24);
    x38 = ((uint64_t)(arg1[26]) << 16);
    x39 = ((uint64_t)(arg1[25]) << 8);
    x40 = (arg1[24]);
    x41 = ((uint64_t)(arg1[23]) << 56);
    x42 = ((uint64_t)(arg1[22]) << 48);
    x43 = ((uint64_t)(arg1[21]) << 40);
    x44 = ((uint64_t)(arg1[20]) << 32);
    x45 = ((uint64_t)(arg1[19]) << 24);
    x46 = ((uint64_t)(arg1[18]) << 16);
    x47 = ((uint64_t)(arg1[17]) << 8);
    x48 = (arg1[16]);
    x49 = ((uint64_t)(arg1[15]) << 56);
    x50 = ((uint64_t)(arg1[14]) << 48);
    x51 = ((uint64_t)(arg1[13]) << 40);
    x52 = ((uint64_t)(arg1[12]) << 32);
    x53 = ((uint64_t)(arg1[11]) << 24);
    x54 = ((uint64_t)(arg1[10]) << 16);
    x55 = ((uint64_t)(arg1[9]) << 8);
    x56 = (arg1[8]);
    x57 = ((uint64_t)(arg1[7]) << 56);
    x58 = ((uint64_t)(arg1[6]) << 48);
    x59 = ((uint64_t)(arg1[5]) << 40);
    x60 = ((uint64_t)(arg1[4]) << 32);
    x61 = ((uint64_t)(arg1[3]) << 24);
    x62 = ((uint64_t)(arg1[2]) << 16);
    x63 = ((uint64_t)(arg1[1]) << 8);
    x64 = (arg1[0]);
    x65 = (x63 + (uint64_t)x64);
    x66 = (x62 + x65);
    x67 = (x61 + x66);
    x68 = (x60 + x67);
    x69 = (x59 + x68);
    x70 = (x58 + x69);
    x71 = (x57 + x70);
    x72 = (x55 + (uint64_t)x56);
    x73 = (x54 + x72);
    x74 = (x53 + x73);
    x75 = (x52 + x74);
    x76 = (x51 + x75);
    x77 = (x50 + x76);
    x78 = (x49 + x77);
    x79 = (x47 + (uint64_t)x48);
    x80 = (x46 + x79);
    x81 = (x45 + x80);
    x82 = (x44 + x81);
    x83 = (x43 + x82);
    x84 = (x42 + x83);
    x85 = (x41 + x84);
    x86 = (x39 + (uint64_t)x40);
    x87 = (x38 + x86);
    x88 = (x37 + x87);
    x89 = (x36 + x88);
    x90 = (x35 + x89);
    x91 = (x34 + x90);
    x92 = (x33 + x91);
    x93 = (x31 + (uint64_t)x32);
    x94 = (x30 + x93);
    x95 = (x29 + x94);
    x96 = (x28 + x95);
    x97 = (x27 + x96);
    x98 = (x26 + x97);
    x99 = (x25 + x98);
    x100 = (x23 + (uint64_t)x24);
    x101 = (x22 + x100);
    x102 = (x21 + x101);
    x103 = (x20 + x102);
    x104 = (x19 + x103);
    x105 = (x18 + x104);
    x106 = (x17 + x105);
    x107 = (x15 + (uint64_t)x16);
    x108 = (x14 + x107);
    x109 = (x13 + x108);
    x110 = (x12 + x109);
    x111 = (x11 + x110);
    x112 = (x10 + x111);
    x113 = (x9 + x112);
    x114 = (x7 + (uint64_t)x8);
    x115 = (x6 + x114);
    x116 = (x5 + x115);
    x117 = (x4 + x116);
    x118 = (x3 + x117);
    x119 = (x2 + x118);
    x120 = (x1 + x119);
    out1[0] = x71;
    out1[1] = x78;
    out1[2] = x85;
    out1[3] = x92;
    out1[4] = x99;
    out1[5] = x106;
    out1[6] = x113;
    out1[7] = x120;
}